

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  byte *pbVar1;
  ImGuiDockNode **ppIVar2;
  float *pfVar3;
  ImVec4 *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ImGuiViewportP *pIVar11;
  ImVec2 IVar12;
  ImDrawList *pIVar13;
  ImGuiTabBar *pIVar14;
  ImGuiTabBar *this;
  ImGuiCol idx;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ImGuiCol IVar19;
  ImGuiViewportFlags IVar20;
  ImGuiViewportFlags IVar21;
  ImGuiContext *pIVar22;
  ImGuiContext *pIVar23;
  ImGuiContext *pIVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  byte bVar27;
  bool bVar28;
  bool bVar29;
  ImU32 IVar30;
  int iVar31;
  ImGuiID IVar32;
  ImGuiID IVar33;
  ImGuiWindow **ppIVar34;
  ImGuiDockNode **ppIVar35;
  ImGuiWindow *pIVar36;
  ImGuiDockNode *pIVar37;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ImGuiWindow *pIVar38;
  char *label;
  ImGuiTabItem *pIVar39;
  ImGuiID *pIVar40;
  short sVar41;
  ushort uVar42;
  float fVar43;
  ImVec2 *pIVar44;
  int buf_size;
  bool *p_open;
  int n;
  int iVar45;
  int iVar46;
  int iVar47;
  ImGuiPayload *this_00;
  char cVar48;
  int window_n_1;
  uint uVar49;
  int iVar50;
  ImVector<ImGuiWindow_*> *pIVar51;
  long lVar52;
  int n_1;
  long lVar53;
  bool bVar54;
  bool bVar55;
  float fVar56;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  ImRect IVar57;
  ImRect IVar58;
  ImRect outer;
  ImVec4 IVar59;
  ImGuiID local_194;
  uint local_190;
  ImGuiDockNode *local_158;
  ImRect title_bar_rect;
  bool tab_open;
  undefined3 uStack_f7;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  ImGuiDockNode *local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  char window_label [20];
  undefined4 uStack_94;
  ImRect tab_bar_rect;
  
  pIVar22 = GImGui;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3665,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xbe = node->field_0xbe & 0xf7;
  ppIVar2 = &node->CentralNode;
  node->CentralNode = (ImGuiDockNode *)0x0;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node);
    window_label[0] = '\0';
    window_label[1] = '\0';
    window_label[2] = '\0';
    window_label[3] = '\0';
    window_label[4] = '\0';
    window_label[5] = '\0';
    window_label[6] = '\0';
    window_label[7] = '\0';
    window_label[8] = '\0';
    window_label[9] = '\0';
    window_label[10] = '\0';
    window_label[0xb] = '\0';
    window_label[0xc] = '\0';
    window_label[0xd] = '\0';
    window_label[0xe] = '\0';
    window_label[0xf] = '\0';
    window_label[0x10] = '\0';
    window_label[0x11] = '\0';
    window_label[0x12] = '\0';
    window_label[0x13] = '\0';
    uStack_94 = 0;
    DockNodeFindInfo(node,(ImGuiDockNodeTreeInfo *)window_label);
    node->CentralNode = (ImGuiDockNode *)window_label._0_8_;
    pIVar37 = (ImGuiDockNode *)0x0;
    if (window_label._16_4_ == 1) {
      pIVar37 = (ImGuiDockNode *)window_label._8_8_;
    }
    node->OnlyNodeWithWindows = pIVar37;
    node->CountNodeWithWindows = window_label._16_4_;
    ppIVar35 = ppIVar2;
    if (window_label._8_8_ == 0 || node->LastFocusedNodeId != 0) {
      if (window_label._8_8_ != 0) goto LAB_0013dc62;
    }
    else {
      node->LastFocusedNodeId = *(ImGuiID *)window_label._8_8_;
LAB_0013dc62:
      pIVar51 = (ImVector<ImGuiWindow_*> *)(window_label._8_8_ + 0x30);
      ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
      pIVar36 = *ppIVar34;
      IVar33 = (pIVar36->WindowClass).ParentViewportId;
      IVar20 = (pIVar36->WindowClass).ViewportFlagsOverrideSet;
      IVar21 = (pIVar36->WindowClass).ViewportFlagsOverrideClear;
      uVar15 = *(undefined4 *)((long)&(pIVar36->WindowClass).ViewportFlagsOverrideSet + 2);
      uVar16 = *(undefined4 *)((long)&(pIVar36->WindowClass).ViewportFlagsOverrideClear + 2);
      in_XMM1_Dc = *(float *)((long)&(pIVar36->WindowClass).TabItemFlagsOverrideSet + 2);
      in_XMM1_Dd = *(float *)((long)&(pIVar36->WindowClass).DockNodeFlagsOverrideSet + 2);
      (node->WindowClass).ClassId = (pIVar36->WindowClass).ClassId;
      (node->WindowClass).ParentViewportId = IVar33;
      (node->WindowClass).ViewportFlagsOverrideSet = IVar20;
      (node->WindowClass).ViewportFlagsOverrideClear = IVar21;
      *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) = uVar15;
      *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar16;
      *(float *)((long)&(node->WindowClass).TabItemFlagsOverrideSet + 2) = in_XMM1_Dc;
      *(float *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = in_XMM1_Dd;
      for (iVar45 = 1; iVar45 < pIVar51->Size; iVar45 = iVar45 + 1) {
        ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar45);
        if (((*ppIVar34)->WindowClass).DockingAllowUnclassed == false) {
          ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar45);
          pIVar36 = *ppIVar34;
          IVar33 = (pIVar36->WindowClass).ParentViewportId;
          IVar20 = (pIVar36->WindowClass).ViewportFlagsOverrideSet;
          IVar21 = (pIVar36->WindowClass).ViewportFlagsOverrideClear;
          uVar15 = *(undefined4 *)((long)&(pIVar36->WindowClass).ViewportFlagsOverrideSet + 2);
          uVar16 = *(undefined4 *)((long)&(pIVar36->WindowClass).ViewportFlagsOverrideClear + 2);
          in_XMM1_Dc = *(float *)((long)&(pIVar36->WindowClass).TabItemFlagsOverrideSet + 2);
          in_XMM1_Dd = *(float *)((long)&(pIVar36->WindowClass).DockNodeFlagsOverrideSet + 2);
          (node->WindowClass).ClassId = (pIVar36->WindowClass).ClassId;
          (node->WindowClass).ParentViewportId = IVar33;
          (node->WindowClass).ViewportFlagsOverrideSet = IVar20;
          (node->WindowClass).ViewportFlagsOverrideClear = IVar21;
          *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) = uVar15;
          *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar16;
          *(float *)((long)&(node->WindowClass).TabItemFlagsOverrideSet + 2) = in_XMM1_Dc;
          *(float *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = in_XMM1_Dd;
          break;
        }
      }
    }
    while (pIVar37 = *ppIVar35, pIVar37 != (ImGuiDockNode *)0x0) {
      pIVar37->field_0xbd = pIVar37->field_0xbd | 0x20;
      ppIVar35 = &pIVar37->ParentNode;
    }
  }
  if ((node->TabBar != (ImGuiTabBar *)0x0) && ((node->MergedFlags & 0x1000) != 0)) {
    DockNodeRemoveTabBar(node);
  }
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && ((node->MergedFlags & 0x400U) == 0)) {
    pIVar51 = &node->Windows;
    iVar45 = (node->Windows).Size;
    if ((((iVar45 < 2) &&
         ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 &&
          ((pIVar22->IO).ConfigDockingAlwaysTabBar == false)))) &&
        ((iVar45 == 0 ||
         (ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0),
         ((*ppIVar34)->WindowClass).DockingAlwaysTabBar != true)))) ||
       (node->CountNodeWithWindows == 0)) {
      if (pIVar51->Size == 1) {
        ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
        pIVar36 = *ppIVar34;
        node->Pos = pIVar36->Pos;
        node->Size = pIVar36->SizeFull;
        *(ushort *)&node->field_0xbc = (ushort)*(undefined4 *)&node->field_0xbc & 0xfe00 | 0x92;
        pIVar38 = node->HostWindow;
        if (pIVar38 != (ImGuiWindow *)0x0) {
          if (pIVar22->NavWindow == pIVar38) {
            FocusWindow(pIVar36);
            pIVar38 = node->HostWindow;
            if (pIVar38 == (ImGuiWindow *)0x0) goto LAB_0013ded8;
          }
          pIVar11 = pIVar38->Viewport;
          pIVar36->Viewport = pIVar11;
          pIVar36->ViewportId = pIVar38->ViewportId;
          if (pIVar38->ViewportOwned == true) {
            pIVar11->Window = pIVar36;
            pIVar36->ViewportOwned = true;
          }
        }
      }
LAB_0013ded8:
      DockNodeHideHostWindow(node);
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
      node->WantCloseTabId = 0;
      node->field_0xbd = node->field_0xbd & 0xa7;
      node->LastFrameActive = pIVar22->FrameCount;
      if ((node->field_0xbe & 1) == 0) {
        return;
      }
      if (pIVar51->Size != 1) {
        return;
      }
      ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
      DockNodeStartMouseMovingWindow(node,*ppIVar34);
      return;
    }
  }
  uVar42 = (ushort)*(uint *)&node->field_0xbc;
  if (((((*(uint *)&node->field_0xbc >> 9 & 1) != 0) && (node->HostWindow == (ImGuiWindow *)0x0)) &&
      (node->ParentNode == (ImGuiDockNode *)0x0)) &&
     (((node->MergedFlags & 0x400U) == 0 && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)))) {
    iVar45 = (node->Windows).Size;
    if (iVar45 < 1) {
      __assert_fail("node->Windows.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x36ac,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    pIVar51 = &node->Windows;
    IVar33 = node->SelectedTabId;
    if (IVar33 != 0) {
      for (iVar46 = 0; iVar46 < iVar45; iVar46 = iVar46 + 1) {
        ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar46);
        if ((*ppIVar34)->ID == IVar33) {
          ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar46);
          pIVar36 = *ppIVar34;
          if (pIVar36 != (ImGuiWindow *)0x0) goto LAB_0013e9da;
          break;
        }
        iVar45 = pIVar51->Size;
      }
    }
    ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
    pIVar36 = *ppIVar34;
LAB_0013e9da:
    if (('\0' < pIVar36->AutoFitFramesX) || ('\0' < pIVar36->AutoFitFramesY)) {
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
      return;
    }
    uVar42 = *(ushort *)&node->field_0xbc;
  }
  uVar9 = node->MergedFlags;
  iVar45 = (node->Windows).Size;
  pIVar51 = &node->Windows;
  *(ushort *)&node->field_0xbc =
       uVar42 & 0xe7ff | (ushort)((uVar9 >> 0xe & 1) == 0 && 0 < iVar45) << 0xc;
  for (iVar46 = 0; iVar46 < iVar45; iVar46 = iVar46 + 1) {
    ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar46);
    pIVar36 = *ppIVar34;
    iVar45._0_1_ = pIVar36->HasCloseButton;
    iVar45._1_1_ = pIVar36->ResizeBorderHeld;
    iVar45._2_2_ = pIVar36->BeginCount;
    *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc | (ushort)(iVar45 << 0xb);
    pIVar36->field_0x3e1 = pIVar36->field_0x3e1 & 0xfe | 1 < (node->Windows).Size;
    iVar45 = (node->Windows).Size;
  }
  if ((short)uVar9 < 0) {
    node->field_0xbd = node->field_0xbd & 0xf7;
  }
  if ((node->MergedFlags & 0x400) == 0) {
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      uVar49 = *(uint *)&node->field_0xbc;
      if ((uVar49 >> 9 & 1) == 0) {
        bVar8 = false;
        pIVar36 = (ImGuiWindow *)0x0;
      }
      else {
        if (iVar45 < 1) {
          pIVar36 = (ImGuiWindow *)0x0;
        }
        else {
          ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
          pIVar36 = *ppIVar34;
          uVar49 = (uint)*(ushort *)&node->field_0xbc;
        }
        pIVar23 = GImGui;
        sVar41 = (short)(uVar49 << 0xd);
        pIVar38 = pIVar36;
        if ((sVar41 == 0x4000 && pIVar36 != (ImGuiWindow *)0x0) ||
           (pIVar38 = (ImGuiWindow *)node, sVar41 == 0x2000)) {
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar23->NextWindowData).PosVal = pIVar38->Pos;
          (pIVar23->NextWindowData).PosPivotVal.x = 0.0;
          (pIVar23->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar23->NextWindowData).PosCond = 1;
          (pIVar23->NextWindowData).PosUndock = true;
        }
        pIVar23 = GImGui;
        sVar41 = (short)((uint)(int)(short)(*(int *)&node->field_0xbc << 10) >> 0xd);
        if (sVar41 == 2 && pIVar36 != (ImGuiWindow *)0x0) {
          pIVar44 = &pIVar36->SizeFull;
LAB_0013e070:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
          (pIVar23->NextWindowData).SizeVal = *pIVar44;
          (pIVar23->NextWindowData).SizeCond = 1;
        }
        else if (sVar41 == 1) {
          pIVar44 = &node->Size;
          goto LAB_0013e070;
        }
        pIVar23 = GImGui;
        uVar42 = *(ushort *)&node->field_0xbc;
        if ((uVar42 & 0x38) == 0x10 && pIVar36 != (ImGuiWindow *)0x0) {
          bVar8 = pIVar36->Collapsed;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
          (pIVar23->NextWindowData).CollapsedVal = bVar8;
          (pIVar23->NextWindowData).CollapsedCond = 1;
          uVar42 = *(ushort *)&node->field_0xbc;
        }
        pIVar23 = GImGui;
        if ((uVar42 & 0x1c0) == 0x80 && pIVar36 != (ImGuiWindow *)0x0) {
          IVar33 = pIVar36->ViewportId;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x100;
          (pIVar23->NextWindowData).ViewportId = IVar33;
        }
        SetNextWindowClass(&node->WindowClass);
        DockNodeGetHostWindowTitle(node,window_label,buf_size);
        title_bar_rect.Min.x = 0.0;
        title_bar_rect.Min.y = 0.0;
        PushStyleVar(2,&title_bar_rect.Min);
        Begin(window_label,(bool *)0x0,0x20081139);
        PopStyleVar(1);
        pIVar36 = pIVar22->CurrentWindow;
        DockNodeSetupHostWindow(node,pIVar36);
        IVar12 = pIVar36->Pos;
        (pIVar36->DC).CursorPos = IVar12;
        node->Pos = IVar12;
        node->Size = pIVar36->Size;
        if (node->HostWindow->Appearing == true) {
          BringWindowToDisplayFront(node->HostWindow);
        }
        *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xfe00;
        bVar8 = true;
      }
    }
    else {
      pIVar36 = node->ParentNode->HostWindow;
      node->HostWindow = pIVar36;
      *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xfe00;
      bVar8 = false;
    }
    if (((node->field_0xbe & 1) != 0) && (node->HostWindow != (ImGuiWindow *)0x0)) {
      DockNodeStartMouseMovingWindow(node,node->HostWindow);
    }
  }
  else {
    pIVar36 = node->HostWindow;
    if (pIVar36 == (ImGuiWindow *)0x0) {
      __assert_fail("node->HostWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x36ce,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    bVar8 = false;
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) && (node->TabBar != (ImGuiTabBar *)0x0)) {
    __assert_fail("node->TabBar == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3717,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    if (pIVar22->NavWindow != (ImGuiWindow *)0x0) {
      pIVar38 = pIVar22->NavWindow->RootWindow;
      pIVar37 = pIVar38->DockNode;
      if ((pIVar37 != (ImGuiDockNode *)0x0) && (pIVar38->ParentWindow == pIVar36)) {
        node->LastFocusedNodeId = pIVar37->ID;
      }
    }
    if (pIVar36 == (ImGuiWindow *)0x0) {
      bVar54 = false;
      goto LAB_0013e1f4;
    }
    uVar49 = uVar9 >> 3 & 1;
    cVar48 = (char)uVar49;
    if (uVar49 == 0) {
      local_158 = *ppIVar2;
LAB_0013e5cb:
      bVar27 = (byte)uVar9 >> 3;
      pIVar37 = (ImGuiDockNode *)(ulong)CONCAT31((int3)(uVar9 >> 8),bVar27);
      bVar54 = true;
      if ((local_158 != (ImGuiDockNode *)0x0 & bVar27) == 1) {
        bVar55 = false;
        if ((local_158->ChildNodes[0] == (ImGuiDockNode *)0x0) && ((local_158->Windows).Size == 0))
        {
          if (GImGui->DragDropActive == true) {
            this_00 = &GImGui->DragDropPayload;
            bVar54 = ImGuiPayload::IsDataType(this_00,"_IMWINDOW");
            pIVar37 = (ImGuiDockNode *)CONCAT71(extraout_var,bVar54);
            if (!bVar54) goto LAB_0013e646;
            bVar54 = DockNodeIsDropAllowed(pIVar36,*this_00->Data);
            pIVar37 = (ImGuiDockNode *)CONCAT71(extraout_var_00,bVar54);
            if (!bVar54) goto LAB_0013e646;
          }
          else {
LAB_0013e646:
            if ((node->MergedFlags & 0x400) == 0) {
              __assert_fail("node->IsDockSpace()",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                            ,0x3732,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
            }
            pIVar37 = DockNodeGetRootNode(pIVar37);
            fVar56 = (pIVar37->Pos).x;
            fVar43 = (pIVar37->Pos).y;
            window_label._0_4_ = (local_158->Pos).x;
            window_label._4_4_ = (local_158->Pos).y;
            window_label._8_4_ = (local_158->Size).x + (float)window_label._0_4_;
            in_XMM1_Dc = (local_158->Size).y + (float)window_label._4_4_;
            if (fVar56 < (float)window_label._0_4_) {
              window_label._0_4_ = (float)window_label._0_4_ + 4.0;
            }
            if ((float)window_label._8_4_ < (pIVar37->Size).x + fVar56) {
              window_label._8_4_ = (float)window_label._8_4_ + -4.0;
            }
            if (fVar43 < (float)window_label._4_4_) {
              window_label._4_4_ = (float)window_label._4_4_ + 4.0;
            }
            window_label._12_4_ = in_XMM1_Dc;
            if (in_XMM1_Dc < (pIVar37->Size).y + fVar43) {
              window_label._12_4_ = in_XMM1_Dc + -4.0;
            }
            in_XMM1_Dd = in_XMM1_Dc;
            if (((float)window_label._0_4_ <= (float)window_label._8_4_) &&
               ((float)window_label._4_4_ <= (float)window_label._12_4_)) {
              title_bar_rect.Min.y = (float)window_label._12_4_ - (float)window_label._4_4_;
              title_bar_rect.Min.x = (float)window_label._8_4_ - (float)window_label._0_4_;
              SetWindowHitTestHole(pIVar36,(ImVec2 *)window_label,&title_bar_rect.Min);
              in_XMM1_Dc = 0.0;
              in_XMM1_Dd = 0.0;
              title_bar_rect.Min.y = SUB84(window_label._8_8_,4) - SUB84(window_label._0_8_,4);
              title_bar_rect.Min.x = (float)window_label._8_8_ - (float)window_label._0_8_;
              SetWindowHitTestHole(pIVar36->ParentWindow,(ImVec2 *)window_label,&title_bar_rect.Min)
              ;
            }
          }
          bVar55 = true;
          bVar54 = true;
        }
      }
      else {
        bVar55 = false;
      }
    }
    else {
      ImDrawList::ChannelsSplit(pIVar36->DrawList,2);
      ImDrawList::ChannelsSetCurrent(pIVar36->DrawList,1);
      local_158 = node->CentralNode;
      if (node->ParentNode == (ImGuiDockNode *)0x0) goto LAB_0013e5cb;
      bVar55 = false;
      bVar54 = true;
      cVar48 = '\x01';
    }
  }
  else {
    bVar54 = pIVar36 != (ImGuiWindow *)0x0;
LAB_0013e1f4:
    local_158 = *ppIVar2;
    cVar48 = '\0';
    bVar55 = false;
  }
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (bVar54)) {
    in_XMM1_Dc = 0.0;
    in_XMM1_Dd = 0.0;
    DockNodeTreeUpdatePosSize(node,pIVar36->Pos,pIVar36->Size,false);
    DockNodeTreeUpdateSplitter(node);
  }
  if ((((bVar54) && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) && ((node->Windows).Size == 0))
     && (((uVar9 & 8) == 0 & (byte)node->field_0xbd >> 1) == 1)) {
    pIVar13 = pIVar36->DrawList;
    in_XMM1_Dc = 0.0;
    in_XMM1_Dd = 0.0;
    window_label._4_4_ = (node->Size).y + (node->Pos).y;
    window_label._0_4_ = (node->Size).x + (node->Pos).x;
    IVar30 = GetColorU32(0x27,1.0);
    ImDrawList::AddRectFilled(pIVar13,&node->Pos,(ImVec2 *)window_label,IVar30,0.0,0);
  }
  if ((cVar48 != '\0') && ((node->field_0xbd & 2) != 0)) {
    ImDrawList::ChannelsSetCurrent(pIVar36->DrawList,0);
    pIVar13 = pIVar36->DrawList;
    if (bVar55) {
      IVar57 = ImGuiDockNode::Rect(node);
      local_d8._8_4_ = in_XMM1_Dc;
      local_d8._0_4_ = IVar57.Max.x;
      local_d8._4_4_ = IVar57.Max.y;
      local_d8._12_4_ = in_XMM1_Dd;
      IVar58 = ImGuiDockNode::Rect(local_158);
      local_e8._8_4_ = in_XMM1_Dc;
      local_e8._0_4_ = IVar58.Max.x;
      local_e8._4_4_ = IVar58.Max.y;
      local_e8._12_4_ = in_XMM1_Dd;
      IVar30 = GetColorU32(2,1.0);
      auVar26 = local_d8;
      auVar25 = local_e8;
      outer.Max.x = (float)local_d8._0_4_;
      outer.Max.y = (float)local_d8._4_4_;
      outer.Min = IVar57.Min;
      IVar57.Max.x = (float)local_e8._0_4_;
      IVar57.Max.y = (float)local_e8._4_4_;
      IVar57.Min = IVar58.Min;
      local_e8 = auVar25;
      local_d8 = auVar26;
      RenderRectFilledWithHole(pIVar13,outer,IVar57,IVar30,0.0);
    }
    else {
      window_label._4_4_ = (node->Size).y + (node->Pos).y;
      window_label._0_4_ = (node->Size).x + (node->Pos).x;
      IVar30 = GetColorU32(2,1.0);
      ImDrawList::AddRectFilled(pIVar13,&node->Pos,(ImVec2 *)window_label,IVar30,0.0,0);
    }
    ImDrawList::ChannelsMerge(pIVar36->DrawList);
  }
  pIVar23 = GImGui;
  if (bVar54) {
    uVar42 = *(ushort *)&node->field_0xbc;
    if ((node->Windows).Size < 1) goto LAB_0013e4e1;
    iVar46 = node->LastFrameActive + 1;
    iVar45 = GImGui->FrameCount;
    local_d8._0_4_ = iVar46;
    local_e8._0_4_ = iVar45;
    IVar33 = node->WantCloseTabId;
    *(short *)&node->field_0xbc = (short)(uVar42 & 0xbfff);
    node->WantCloseTabId = 0;
    pIVar37 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)(uVar42 & 0xbfff));
    if (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0) {
      if ((pIVar23->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar23->NavWindow->RootWindowForTitleBarHighlight == pIVar36->RootWindowDockTree)) {
        bVar55 = pIVar37->LastFocusedNodeId == node->ID;
        goto LAB_0013e4cc;
      }
      local_190 = 0;
    }
    else {
      bVar55 = pIVar23->NavWindowingTarget->DockNode == node;
LAB_0013e4cc:
      local_190 = (uint)bVar55;
    }
    if ((node->MergedFlags & 0x3000U) == 0) {
      bVar55 = pIVar36->SkipItems;
      if (((uint)node->MergedFlags >> 10 & 1) == 0) {
        pIVar36->SkipItems = false;
        (pIVar36->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      }
      local_c0 = pIVar37;
      PushOverrideID(node->ID);
      pIVar14 = node->TabBar;
      this = pIVar14;
      if (pIVar14 == (ImGuiTabBar *)0x0) {
        DockNodeAddTabBar(node);
        this = node->TabBar;
      }
      *(ushort *)&node->field_0xbc =
           (ushort)*(undefined4 *)&node->field_0xbc & 0xfbff | (ushort)(local_190 << 10);
      iVar50 = 0;
      if ((node->MergedFlags & 0x4000) == 0) {
        if ((pIVar23->Style).WindowMenuButtonPosition == -1) {
          bVar28 = false;
          local_194 = 0;
        }
        else {
          local_194 = 0;
          bVar28 = IsPopupOpen("#WindowMenu",0);
          pIVar24 = GImGui;
          if (bVar28) {
            fVar56 = (node->Pos).x;
            bVar28 = true;
            if ((GImGui->Style).WindowMenuButtonPosition == 0) {
              fVar43 = 0.0;
            }
            else {
              fVar56 = fVar56 + (node->Size).x;
              fVar43 = 1.0;
            }
            local_194 = 0;
            fVar5 = (GImGui->Style).FramePadding.y;
            fVar6 = GImGui->FontSize;
            fVar7 = (node->Pos).y;
            (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
            (pIVar24->NextWindowData).PosVal.x = fVar56;
            (pIVar24->NextWindowData).PosVal.y = fVar5 + fVar5 + fVar6 + fVar7;
            (pIVar24->NextWindowData).PosPivotVal.x = fVar43;
            (pIVar24->NextWindowData).PosPivotVal.y = 0.0;
            (pIVar24->NextWindowData).PosCond = 1;
            (pIVar24->NextWindowData).PosUndock = true;
            bVar29 = BeginPopup("#WindowMenu",0);
            if (bVar29) {
              node->field_0xbd = node->field_0xbd | 4;
              iVar31 = (this->Tabs).Size;
              if (iVar31 == 1) {
                IVar32 = 0;
                bVar29 = MenuItem("Hide tab bar",(char *)0x0,
                                  (bool)((byte)((uint)node->MergedFlags >> 0xd) & 1),true);
                if (bVar29) {
                  node->field_0xbe = node->field_0xbe | 4;
                }
              }
              else {
                IVar32 = 0;
                for (iVar47 = 0; iVar47 < iVar31; iVar47 = iVar47 + 1) {
                  pIVar39 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,iVar47);
                  if ((pIVar39->Flags & 0x200000) == 0) {
                    label = ImGuiTabBar::GetTabName(this,pIVar39);
                    window_label[0] = '\0';
                    window_label[1] = '\0';
                    window_label[2] = '\0';
                    window_label[3] = '\0';
                    window_label[4] = '\0';
                    window_label[5] = '\0';
                    window_label[6] = '\0';
                    window_label[7] = '\0';
                    bVar29 = Selectable(label,pIVar39->ID == this->SelectedTabId,0,
                                        (ImVec2 *)window_label);
                    if (bVar29) {
                      IVar32 = pIVar39->ID;
                    }
                    SameLine(0.0,-1.0);
                    Text("   ");
                  }
                  iVar31 = (this->Tabs).Size;
                }
              }
              EndPopup();
              if (IVar32 != 0) {
                this->NextSelectedTabId = IVar32;
                local_194 = IVar32;
              }
            }
            local_190 = (uint)(byte)((byte)local_190 | (node->field_0xbd & 4) >> 2);
          }
          else {
            bVar28 = true;
          }
        }
      }
      else {
        bVar28 = false;
        local_194 = 0;
      }
      title_bar_rect.Min.x = 0.0;
      title_bar_rect.Min.y = 0.0;
      title_bar_rect.Max.x = 0.0;
      title_bar_rect.Max.y = 0.0;
      tab_bar_rect.Min.x = 0.0;
      tab_bar_rect.Min.y = 0.0;
      tab_bar_rect.Max.x = 0.0;
      tab_bar_rect.Max.y = 0.0;
      local_b0.x = 0.0;
      local_b0.y = 0.0;
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      DockNodeCalcTabBarLayout(node,&title_bar_rect,&tab_bar_rect,&local_b0,&local_b8);
      iVar31 = (this->Tabs).Size;
      for (; iVar50 < pIVar51->Size; iVar50 = iVar50 + 1) {
        ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar50);
        pIVar38 = *ppIVar34;
        pIVar39 = TabBarFindTabByID(this,pIVar38->ID);
        if (pIVar39 == (ImGuiTabItem *)0x0) {
          TabBarAddTab(this,0x400000,pIVar38);
        }
      }
      if ((char)local_190 == '\0') {
        IVar19 = 10;
      }
      else {
        node->LastFrameFocused = pIVar23->FrameCount;
        IVar19 = 0xb;
      }
      idx = 0xc;
      if (pIVar36->Collapsed == false) {
        idx = IVar19;
      }
      IVar30 = GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled
                (pIVar36->DrawList,&title_bar_rect.Min,&title_bar_rect.Max,IVar30,
                 pIVar36->WindowRounding,0x30);
      if (bVar28) {
        IVar32 = ImGuiWindow::GetID(pIVar36,"#COLLAPSE",(char *)0x0);
        bVar28 = CollapseButton(IVar32,&local_b0,node);
        if (bVar28) {
          OpenPopup("#WindowMenu",0);
        }
        if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (GImGui->LastItemData).ID)) {
          local_194 = this->SelectedTabId;
        }
      }
      lVar52 = (long)(this->Tabs).Size;
      lVar53 = lVar52 * -0x30;
      for (; iVar50 = (int)lVar52, 0 < iVar50; lVar52 = lVar52 + -1) {
        pIVar39 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,iVar50 + -1);
        if ((pIVar39->Flags & 0x400000) == 0) break;
        pIVar39 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,iVar50 + -1);
        pbVar1 = (byte *)((long)&pIVar39->Flags + 2);
        *pbVar1 = *pbVar1 & 0xbf;
        lVar53 = lVar53 + 0x30;
      }
      iVar47 = (this->Tabs).Size;
      if (iVar50 < iVar47 && iVar50 + 1 < iVar47) {
        qsort((void *)((long)(this->Tabs).Data - lVar53),iVar47 - lVar52,0x30,
              TabItemComparerByDockOrder);
      }
      if ((pIVar23->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar38 = pIVar23->NavWindow->RootWindow, pIVar38->DockNode == node)) {
        this->SelectedTabId = pIVar38->ID;
      }
      if ((pIVar14 == (ImGuiTabBar *)0x0) &&
         (pIVar39 = TabBarFindTabByID(this,node->SelectedTabId), pIVar39 != (ImGuiTabItem *)0x0)) {
        pIVar40 = &node->SelectedTabId;
LAB_0013ede2:
        IVar32 = *pIVar40;
        this->NextSelectedTabId = IVar32;
        this->SelectedTabId = IVar32;
      }
      else if (iVar31 < (this->Tabs).Size) {
        pIVar39 = ImVector<ImGuiTabItem>::back(&this->Tabs);
        pIVar40 = &pIVar39->Window->ID;
        goto LAB_0013ede2;
      }
      uVar9 = local_190 << 0x15 | 0x500003;
      if (pIVar36->Collapsed != false) {
        uVar9 = 0x500003;
      }
      BeginTabBarEx(this,&tab_bar_rect,uVar9,node);
      window_label[0x10] = '\0';
      window_label[0x11] = '\0';
      window_label[0x12] = '\0';
      window_label[0x13] = '\0';
      uStack_94 = 0;
      window_label[0] = '\0';
      window_label[1] = '\0';
      window_label[2] = '\0';
      window_label[3] = '\0';
      window_label[4] = '\0';
      window_label[5] = '\0';
      window_label[6] = '\0';
      window_label[7] = '\0';
      window_label[8] = '\0';
      window_label[9] = '\0';
      window_label[10] = '\0';
      window_label[0xb] = '\0';
      window_label[0xc] = '\0';
      window_label[0xd] = '\0';
      window_label[0xe] = '\0';
      window_label[0xf] = '\0';
      for (lVar52 = 0; lVar52 != 0x18; lVar52 = lVar52 + 4) {
        pIVar4 = (pIVar23->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar52);
        uVar17 = *(undefined8 *)&pIVar4->z;
        *(undefined8 *)(window_label + lVar52 * 4) = *(undefined8 *)pIVar4;
        *(undefined8 *)(window_label + lVar52 * 4 + 8) = uVar17;
      }
      node->VisibleWindow = (ImGuiWindow *)0x0;
      for (iVar50 = 0; iVar50 < pIVar51->Size; iVar50 = iVar50 + 1) {
        ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,iVar50);
        pIVar38 = *ppIVar34;
        if ((((((byte)(uVar42 >> 0xe) & iVar46 == iVar45) == 0) &&
             (pIVar38->ID != (uint)(IVar33 != 0 && iVar46 == iVar45))) ||
            (pIVar38->HasCloseButton != true)) || ((pIVar38->Flags & 0x100000) != 0)) {
          if (pIVar23->FrameCount <= pIVar38->LastFrameActive + 1 ||
              local_d8._0_4_ != local_e8._0_4_) {
            uVar9 = pIVar38->Flags;
            uVar49 = (pIVar38->WindowClass).TabItemFlagsOverrideSet;
            uVar10 = this->Flags;
            for (lVar52 = 0; lVar52 != 0x18; lVar52 = lVar52 + 4) {
              IVar59 = ColorConvertU32ToFloat4
                                 (*(ImU32 *)((long)(pIVar38->DockStyle).Colors + lVar52));
              (pIVar23->Style).Colors[*(int *)((long)GWindowDockStyleColors + lVar52)] = IVar59;
            }
            _tab_open = (float)CONCAT31(uStack_f7,1);
            p_open = (bool *)0x0;
            if (pIVar38->HasCloseButton != false) {
              p_open = &tab_open;
            }
            TabItemEx(this,pIVar38->Name,p_open,uVar10 >> 1 & 4 | uVar9 >> 0x14 & 1 | uVar49,pIVar38
                     );
            IVar32 = pIVar38->ID;
            if (tab_open == false) {
              node->WantCloseTabId = IVar32;
            }
            if (this->VisibleTabId == IVar32) {
              node->VisibleWindow = pIVar38;
            }
            pIVar38->DockTabItemStatusFlags = (pIVar23->LastItemData).StatusFlags;
            IVar12 = (pIVar23->LastItemData).Rect.Max;
            (pIVar38->DockTabItemRect).Min = (pIVar23->LastItemData).Rect.Min;
            (pIVar38->DockTabItemRect).Max = IVar12;
            if (((pIVar23->NavWindow != (ImGuiWindow *)0x0) &&
                (pIVar23->NavWindow->RootWindow == pIVar38)) &&
               (((pIVar38->DC).NavLayersActiveMask & 2) == 0)) {
              pIVar36->NavLastIds[1] = IVar32;
            }
          }
        }
      }
      for (lVar52 = 0; lVar52 != 0x18; lVar52 = lVar52 + 4) {
        uVar17 = *(undefined8 *)(window_label + lVar52 * 4);
        uVar18 = *(undefined8 *)(window_label + lVar52 * 4 + 8);
        pIVar4 = (pIVar23->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar52);
        pIVar4->x = (float)(int)uVar17;
        pIVar4->y = (float)(int)((ulong)uVar17 >> 0x20);
        pIVar4->z = (float)(int)uVar18;
        pIVar4->w = (float)(int)((ulong)uVar18 >> 0x20);
      }
      if ((node->VisibleWindow != (ImGuiWindow *)0x0) &&
         (((char)local_190 != '\0' || (local_c0->VisibleWindow == (ImGuiWindow *)0x0)))) {
        local_c0->VisibleWindow = node->VisibleWindow;
      }
      if ((node->field_0xbd & 8) != 0) {
        if ((node->VisibleWindow == (ImGuiWindow *)0x0) ||
           (bVar28 = true, node->VisibleWindow->HasCloseButton == false)) {
          PushItemFlag(4,true);
          fStack_ec = (pIVar23->Style).Colors[0].w * 0.4;
          _tab_open = (pIVar23->Style).Colors[0].x;
          fStack_f4 = (pIVar23->Style).Colors[0].y;
          fStack_f0 = (pIVar23->Style).Colors[0].z;
          bVar28 = false;
          PushStyleColor(0,(ImVec4 *)&tab_open);
        }
        iVar45 = 0;
        IVar33 = ImGuiWindow::GetID(pIVar36,"#CLOSE",(char *)0x0);
        bVar29 = CloseButton(IVar33,&local_b8);
        if (bVar29) {
          node->field_0xbd = node->field_0xbd | 0x40;
          for (; iVar45 < (this->Tabs).Size; iVar45 = iVar45 + 1) {
            pIVar39 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,iVar45);
            TabBarCloseTab(this,pIVar39);
          }
        }
        if (!bVar28) {
          PopStyleColor(1);
          PopItemFlag();
        }
      }
      IVar33 = ImGuiWindow::GetID(pIVar36,"#TITLEBAR",(char *)0x0);
      if (((pIVar23->HoveredId == 0) || (pIVar23->HoveredId == IVar33)) ||
         (pIVar23->ActiveId == IVar33)) {
        ButtonBehavior(&title_bar_rect,IVar33,(bool *)0x0,&tab_open,0x1000);
        if (pIVar23->HoveredId == IVar33) {
          (pIVar23->LastItemData).ID = IVar33;
          SetItemAllowOverlap();
        }
        if (tab_open == true) {
          pfVar3 = (GImGui->IO).MouseDownDuration;
          IVar33 = this->SelectedTabId;
          if (*pfVar3 != 0.0) {
            IVar33 = local_194;
          }
          if (NAN(*pfVar3)) {
            IVar33 = local_194;
          }
          pIVar39 = TabBarFindTabByID(this,this->SelectedTabId);
          local_194 = IVar33;
          if (pIVar39 != (ImGuiTabItem *)0x0) {
            pIVar38 = pIVar39->Window;
            if (pIVar38 == (ImGuiWindow *)0x0) {
              pIVar38 = node->HostWindow;
            }
            StartMouseMovingWindowOrNode(pIVar38,node,false);
          }
        }
      }
      if (this->NextSelectedTabId != 0) {
        local_194 = this->NextSelectedTabId;
      }
      if (((local_194 != 0) &&
          (pIVar39 = TabBarFindTabByID(this,local_194), pIVar39 != (ImGuiTabItem *)0x0)) &&
         (pIVar39->Window != (ImGuiWindow *)0x0)) {
        FocusWindow(pIVar39->Window);
        NavInitWindow(pIVar39->Window,false);
      }
      EndTabBar();
      PopID();
      if ((node->MergedFlags & 0x400) == 0) {
        (pIVar36->DC).NavLayerCurrent = ImGuiNavLayer_Main;
        pIVar36->SkipItems = bVar55;
      }
      goto LAB_0013e4f7;
    }
    if (pIVar51->Size < 1) {
      pIVar38 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
      pIVar38 = *ppIVar34;
    }
    node->VisibleWindow = pIVar38;
    *(ushort *)&node->field_0xbc =
         (ushort)*(undefined4 *)&node->field_0xbc & 0xfbff | (ushort)(local_190 << 10);
    if ((byte)local_190 == 0) {
      if (pIVar38 != (ImGuiWindow *)0x0) {
        if (pIVar37->VisibleWindow == (ImGuiWindow *)0x0) goto LAB_0013e942;
        goto LAB_0013e949;
      }
      goto LAB_0013e4f7;
    }
    node->LastFrameFocused = pIVar23->FrameCount;
    if (pIVar38 == (ImGuiWindow *)0x0) goto LAB_0013e4f7;
LAB_0013e942:
    pIVar37->VisibleWindow = pIVar38;
LAB_0013e949:
    if (node->TabBar != (ImGuiTabBar *)0x0) {
      node->TabBar->VisibleTabId = node->VisibleWindow->ID;
      goto LAB_0013e4f7;
    }
LAB_0013e507:
    if (pIVar51->Size < 1) goto LAB_0013e523;
    ppIVar34 = ImVector<ImGuiWindow_*>::operator[](pIVar51,0);
    IVar33 = (*ppIVar34)->ID;
  }
  else {
    uVar42 = *(ushort *)&node->field_0xbc;
LAB_0013e4e1:
    node->WantCloseTabId = 0;
    *(ushort *)&node->field_0xbc = uVar42 & 0xbbff;
LAB_0013e4f7:
    if ((node->TabBar == (ImGuiTabBar *)0x0) || (IVar33 = node->TabBar->SelectedTabId, IVar33 == 0))
    goto LAB_0013e507;
  }
  node->SelectedTabId = IVar33;
LAB_0013e523:
  if (bVar54) {
    if ((((node->field_0xbd & 2) != 0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar22->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIVar22->MovingWindow->RootWindowDockTree != pIVar36)))) {
      BeginDockableDragDropTarget(pIVar36);
    }
    node->LastFrameActive = pIVar22->FrameCount;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[0]);
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[1]);
    }
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      RenderWindowOuterBorders(pIVar36);
    }
  }
  else {
    node->LastFrameActive = pIVar22->FrameCount;
  }
  if (bVar8) {
    End();
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->IsFloatingNode())
    {
        if (node->Windows.Size <= 1 && node->IsLeafNode())
            if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
                want_to_hide_host_window = true;
        if (node->CountNodeWithWindows == 0)
            want_to_hide_host_window = true;
    }
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->MergedFlags;

    // Decide if the node will have a close button and a window menu button
    node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
    node->HasCloseButton = false;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
        ImGuiWindow* window = node->Windows[window_n];
        node->HasCloseButton |= window->HasCloseButton;
        window->DockIsActive = (node->Windows.Size > 1);
    }
    if (node_flags & ImGuiDockNodeFlags_NoCloseButton)
        node->HasCloseButton = false;

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            host_window = g.CurrentWindow;
            DockNodeSetupHostWindow(node, host_window);
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindow->DockNode && g.NavWindow->RootWindow->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindow->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size
    // _after_ processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // We add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        // (But we only add it if there's something else on the other side of the hole, otherwise for e.g. fullscreen
        // covering passthru node we'd have a gap on the edge not covered by the hole)
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImGuiDockNode* root_node = DockNodeGetRootNode(central_node);
        ImRect root_rect(root_node->Pos, root_node->Pos + root_node->Size);
        ImRect hole_rect(central_node->Pos, central_node->Pos + central_node->Size);
        if (hole_rect.Min.x > root_rect.Min.x) { hole_rect.Min.x += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.x < root_rect.Max.x) { hole_rect.Max.x -= WINDOWS_HOVER_PADDING; }
        if (hole_rect.Min.y > root_rect.Min.y) { hole_rect.Min.y += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.y < root_rect.Max.y) { hole_rect.Max.y -= WINDOWS_HOVER_PADDING; }
        //GetForegroundDrawList()->AddRect(hole_rect.Min, hole_rect.Max, IM_COL32(255, 0, 0, 255));
        if (central_node_hole && !hole_rect.IsInverted())
        {
            SetWindowHitTestHole(host_window, hole_rect.Min, hole_rect.Max - hole_rect.Min);
            SetWindowHitTestHole(host_window->ParentWindow, hole_rect.Min, hole_rect.Max - hole_rect.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindowDockTree != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}